

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O1

int __thiscall ncnn::Requantize::load_model(Requantize *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  int iVar5;
  void *local_78;
  int *piStack_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  int local_40;
  size_t local_38;
  
  (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->scale_in_data_size,1);
  pMVar1 = &this->scale_in_data;
  if (pMVar1 != (Mat *)&local_78) {
    if (piStack_70 != (int *)0x0) {
      LOCK();
      *piStack_70 = *piStack_70 + 1;
      UNLOCK();
    }
    piVar2 = (this->scale_in_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->scale_in_data).data;
        pAVar4 = (this->scale_in_data).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->scale_in_data).cstep = 0;
    *(undefined8 *)((long)&(this->scale_in_data).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->scale_in_data).refcount = (int *)0x0;
    (this->scale_in_data).dims = 0;
    (this->scale_in_data).w = 0;
    (this->scale_in_data).h = 0;
    (this->scale_in_data).d = 0;
    (this->scale_in_data).c = 0;
    (this->scale_in_data).data = local_78;
    (this->scale_in_data).refcount = piStack_70;
    (this->scale_in_data).elemsize = local_68;
    (this->scale_in_data).elempack = local_60;
    (this->scale_in_data).allocator = local_58;
    (this->scale_in_data).dims = local_50;
    (this->scale_in_data).w = iStack_4c;
    (this->scale_in_data).h = iStack_48;
    (this->scale_in_data).d = iStack_44;
    (this->scale_in_data).c = local_40;
    (this->scale_in_data).cstep = local_38;
  }
  if (piStack_70 != (int *)0x0) {
    LOCK();
    *piStack_70 = *piStack_70 + -1;
    UNLOCK();
    if (*piStack_70 == 0) {
      if (local_58 == (Allocator *)0x0) {
        if (local_78 != (void *)0x0) {
          free(local_78);
        }
      }
      else {
        (*local_58->_vptr_Allocator[3])();
      }
    }
  }
  iVar5 = -100;
  if ((pMVar1->data != (void *)0x0) &&
     ((long)(this->scale_in_data).c * (this->scale_in_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->scale_out_data_size,1);
    pMVar1 = &this->scale_out_data;
    if (pMVar1 != (Mat *)&local_78) {
      if (piStack_70 != (int *)0x0) {
        LOCK();
        *piStack_70 = *piStack_70 + 1;
        UNLOCK();
      }
      piVar2 = (this->scale_out_data).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = (this->scale_out_data).data;
          pAVar4 = (this->scale_out_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      (this->scale_out_data).cstep = 0;
      *(undefined8 *)((long)&(this->scale_out_data).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->scale_out_data).elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      (this->scale_out_data).refcount = (int *)0x0;
      (this->scale_out_data).dims = 0;
      (this->scale_out_data).w = 0;
      (this->scale_out_data).h = 0;
      (this->scale_out_data).d = 0;
      (this->scale_out_data).c = 0;
      (this->scale_out_data).data = local_78;
      (this->scale_out_data).refcount = piStack_70;
      (this->scale_out_data).elemsize = local_68;
      (this->scale_out_data).elempack = local_60;
      (this->scale_out_data).allocator = local_58;
      (this->scale_out_data).dims = local_50;
      (this->scale_out_data).w = iStack_4c;
      (this->scale_out_data).h = iStack_48;
      (this->scale_out_data).d = iStack_44;
      (this->scale_out_data).c = local_40;
      (this->scale_out_data).cstep = local_38;
    }
    if (piStack_70 != (int *)0x0) {
      LOCK();
      *piStack_70 = *piStack_70 + -1;
      UNLOCK();
      if (*piStack_70 == 0) {
        if (local_58 == (Allocator *)0x0) {
          if (local_78 != (void *)0x0) {
            free(local_78);
          }
        }
        else {
          (*local_58->_vptr_Allocator[3])();
        }
      }
    }
    if ((pMVar1->data != (void *)0x0) &&
       ((long)(this->scale_out_data).c * (this->scale_out_data).cstep != 0)) {
      if (this->bias_data_size != 0) {
        (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->bias_data_size,1);
        pMVar1 = &this->bias_data;
        if (pMVar1 != (Mat *)&local_78) {
          if (piStack_70 != (int *)0x0) {
            LOCK();
            *piStack_70 = *piStack_70 + 1;
            UNLOCK();
          }
          piVar2 = (this->bias_data).refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              pvVar3 = (this->bias_data).data;
              pAVar4 = (this->bias_data).allocator;
              if (pAVar4 == (Allocator *)0x0) {
                if (pvVar3 != (void *)0x0) {
                  free(pvVar3);
                }
              }
              else {
                (*pAVar4->_vptr_Allocator[3])();
              }
            }
          }
          (this->bias_data).cstep = 0;
          *(undefined8 *)((long)&(this->bias_data).refcount + 4) = 0;
          *(undefined8 *)((long)&(this->bias_data).elemsize + 4) = 0;
          pMVar1->data = (void *)0x0;
          (this->bias_data).refcount = (int *)0x0;
          (this->bias_data).dims = 0;
          (this->bias_data).w = 0;
          (this->bias_data).h = 0;
          (this->bias_data).d = 0;
          (this->bias_data).c = 0;
          (this->bias_data).data = local_78;
          (this->bias_data).refcount = piStack_70;
          (this->bias_data).elemsize = local_68;
          (this->bias_data).elempack = local_60;
          (this->bias_data).allocator = local_58;
          (this->bias_data).dims = local_50;
          (this->bias_data).w = iStack_4c;
          (this->bias_data).h = iStack_48;
          (this->bias_data).d = iStack_44;
          (this->bias_data).c = local_40;
          (this->bias_data).cstep = local_38;
        }
        if (piStack_70 != (int *)0x0) {
          LOCK();
          *piStack_70 = *piStack_70 + -1;
          UNLOCK();
          if (*piStack_70 == 0) {
            if (local_58 == (Allocator *)0x0) {
              if (local_78 != (void *)0x0) {
                free(local_78);
              }
            }
            else {
              (*local_58->_vptr_Allocator[3])();
            }
          }
        }
        if (pMVar1->data == (void *)0x0) {
          return -100;
        }
        if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
          return -100;
        }
      }
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int Requantize::load_model(const ModelBin& mb)
{
    scale_in_data = mb.load(scale_in_data_size, 1);
    if (scale_in_data.empty())
        return -100;

    scale_out_data = mb.load(scale_out_data_size, 1);
    if (scale_out_data.empty())
        return -100;

    if (bias_data_size)
    {
        bias_data = mb.load(bias_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}